

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O1

sexp sexp_write_simple_object(sexp ctx,sexp self,sexp_sint_t n,sexp obj,sexp writer,sexp out)

{
  char *__s;
  uint uVar1;
  sexp psVar2;
  size_t len;
  sexp_conflict exn;
  sexp psVar3;
  sexp extraout_RDX;
  sexp extraout_RDX_00;
  sexp extraout_RDX_01;
  sexp extraout_RDX_02;
  sexp psVar4;
  sexp extraout_RDX_03;
  sexp extraout_RDX_04;
  sexp psVar5;
  long lVar6;
  long lVar7;
  sexp args;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp local_58;
  long local_50;
  sexp_gc_var_t local_48;
  
  local_58 = (sexp)&DAT_0000043e;
  local_48.var = (sexp *)0x0;
  local_48.next = (sexp_gc_var_t *)0x0;
  uVar1 = obj->tag;
  psVar3 = (out->value).type.setters;
  if (psVar3 == (sexp)0x0) {
    putc(0x7b,(FILE *)(out->value).type.getters);
  }
  else {
    psVar4 = (out->value).type.print;
    if (psVar4 < (sexp)(out->value).port.size) {
      (out->value).type.print = (sexp)((long)&psVar4->tag + 1);
      *(undefined1 *)((long)&psVar4->tag + (long)&psVar3->tag) = 0x7b;
    }
    else {
      sexp_buffered_write_char(ctx,0x7b,out);
    }
  }
  psVar3 = (ctx->value).type.setters;
  if ((long)(ulong)uVar1 < (long)(psVar3->value).type.id >> 1) {
    local_48.var = &local_58;
    local_48.next = (ctx->value).context.saves;
    (ctx->value).context.saves = &local_48;
    lVar6 = *(long *)((long)&((psVar3->value).type.getters)->value + (ulong)obj->tag * 8 + 8);
    __s = (char *)(*(long *)(*(long *)(lVar6 + 8) + 8) + 0x10 +
                  *(long *)(*(long *)(lVar6 + 8) + 0x10));
    if ((out->value).type.setters == (sexp)0x0) {
      fputs(__s,(FILE *)(out->value).type.getters);
    }
    else {
      len = strlen(__s);
      sexp_buffered_write_string_n(ctx,__s,len,out);
    }
    psVar3 = (out->value).type.setters;
    if (psVar3 == (sexp)0x0) {
      putc(0x20,(FILE *)(out->value).type.getters);
      psVar4 = extraout_RDX;
    }
    else {
      psVar5 = (out->value).type.print;
      if (psVar5 < (sexp)(out->value).port.size) {
        psVar4 = (sexp)((long)&psVar5->tag + 1);
        (out->value).type.print = psVar4;
        *(undefined1 *)((long)&psVar5->tag + (long)&psVar3->tag) = 0x20;
      }
      else {
        sexp_buffered_write_char(ctx,0x20,out);
        psVar4 = extraout_RDX_00;
      }
    }
    psVar3 = *(sexp *)(lVar6 + 0x30);
    if ((psVar3 == (sexp)&DAT_0000003e) || (psVar3 == (sexp)0x0)) {
      psVar3 = (out->value).type.setters;
      if (psVar3 == (sexp)0x0) {
        putc(0x23,(FILE *)(out->value).type.getters);
        psVar4 = extraout_RDX_01;
      }
      else {
        psVar5 = (out->value).type.print;
        if (psVar5 < (sexp)(out->value).port.size) {
          psVar4 = (sexp)((long)&psVar5->tag + 1);
          (out->value).type.print = psVar4;
          *(undefined1 *)((long)&psVar5->tag + (long)&psVar3->tag) = 0x23;
        }
        else {
          sexp_buffered_write_char(ctx,0x23,out);
          psVar4 = extraout_RDX_02;
        }
      }
      psVar3 = (sexp)((ulong)*(uint *)(lVar6 + 0x50) * 2 + 1);
    }
    psVar5 = (sexp)0x0;
    sexp_write_op(ctx,(sexp)0x0,(sexp_sint_t)psVar4,psVar3,out);
    lVar6 = (long)*(short *)(lVar6 + 0x58) +
            (ulong)*(ushort *)(lVar6 + 0x5c) *
            *(long *)((long)&obj->tag + (long)*(short *)(lVar6 + 0x5a));
    local_58 = sexp_cons_op(ctx,psVar5,(sexp_sint_t)obj,(sexp)&DAT_0000003e,(sexp)&DAT_0000023e);
    local_50 = lVar6;
    if (0 < lVar6) {
      lVar6 = 0;
      lVar7 = 0;
      do {
        psVar3 = *(sexp *)((long)&obj->value + lVar7 * 8);
        if (psVar3 == (sexp)0x0) {
          lVar6 = lVar6 + 1;
        }
        else {
          for (; lVar6 != 0; lVar6 = lVar6 + -1) {
            if ((out->value).type.setters == (sexp)0x0) {
              fputs(" #f",(FILE *)(out->value).type.getters);
            }
            else {
              sexp_buffered_write_string_n(ctx," #f",3,out);
            }
          }
          psVar4 = (out->value).type.setters;
          if (psVar4 == (sexp)0x0) {
            putc(0x20,(FILE *)(out->value).type.getters);
            psVar5 = extraout_RDX_03;
          }
          else {
            psVar2 = (out->value).type.print;
            if (psVar2 < (sexp)(out->value).port.size) {
              psVar5 = (sexp)((long)&psVar2->tag + 1);
              (out->value).type.print = psVar5;
              *(undefined1 *)((long)&psVar2->tag + (long)&psVar4->tag) = 0x20;
            }
            else {
              sexp_buffered_write_char(ctx,0x20,out);
              psVar5 = extraout_RDX_04;
            }
          }
          if ((((ulong)writer & 3) == 0 && writer != (sexp)0x0) &&
             ((writer->tag == 0x1b || (writer->tag == 0x14)))) {
            (local_58->value).type.name = psVar3;
            exn = sexp_apply(ctx,writer,local_58);
            if ((((ulong)exn & 3) == 0) && (exn->tag == 0x13)) {
              sexp_print_exception_op(ctx,(sexp)0x0,2,exn,out);
            }
          }
          else {
            sexp_write_op(ctx,(sexp)0x0,(sexp_sint_t)psVar5,*(sexp *)((long)&obj->value + lVar7 * 8)
                          ,out);
          }
          lVar6 = 0;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != local_50);
    }
    (ctx->value).context.saves = local_48.next;
  }
  else if ((out->value).type.setters == (sexp)0x0) {
    fputs("invalid",(FILE *)(out->value).type.getters);
  }
  else {
    sexp_buffered_write_string_n(ctx,"invalid",7,out);
  }
  psVar3 = (out->value).type.setters;
  if (psVar3 == (sexp)0x0) {
    putc(0x7d,(FILE *)(out->value).type.getters);
  }
  else {
    psVar4 = (out->value).type.print;
    if (psVar4 < (sexp)(out->value).port.size) {
      (out->value).type.print = (sexp)((long)&psVar4->tag + 1);
      *(undefined1 *)((long)&psVar4->tag + (long)&psVar3->tag) = 0x7d;
    }
    else {
      sexp_buffered_write_char(ctx,0x7d,out);
    }
  }
  return (sexp)&DAT_0000043e;
}

Assistant:

sexp sexp_write_simple_object (sexp ctx, sexp self, sexp_sint_t n, sexp obj, sexp writer, sexp out) {
  sexp t, x;
  sexp_gc_var1(args);
  sexp_sint_t i, len, nulls=0;
  i = sexp_pointer_tag(obj);
  sexp_write_char(ctx, '{', out);
  if (i >= sexp_context_num_types(ctx)) {
    sexp_write_string(ctx, "invalid", out);
  } else {
    sexp_gc_preserve1(ctx, args);
    t = sexp_object_type(ctx, obj);
    sexp_write_string(ctx, sexp_string_data(sexp_type_name(t)), out);
    sexp_write_char(ctx, ' ', out);
    if (sexp_type_id(t) && sexp_truep(sexp_type_id(t))) {
      sexp_write(ctx, sexp_type_id(t), out);
    } else {
      sexp_write_char(ctx, '#', out);
      sexp_write(ctx, sexp_make_fixnum(sexp_type_tag(t)), out);
    }
    len = sexp_type_num_slots_of_object(t, obj);
    args = sexp_list1(ctx, SEXP_FALSE);
    for (i=0; i<len; i++) {
      x = sexp_slot_ref(obj, i);
      if (x) {
        for ( ; nulls; --nulls)
          sexp_write_string(ctx, " #f", out);
        sexp_write_char(ctx, ' ', out);
        if (writer && sexp_applicablep(writer)) {
          sexp_car(args) = x;
          x = sexp_apply(ctx, writer, args);
          if (sexp_exceptionp(x)) sexp_print_exception(ctx, x, out);
        } else {
          sexp_write(ctx, sexp_slot_ref(obj, i), out);
        }
      } else {
        nulls++;
      }
    }
    sexp_gc_release1(ctx);
  }
  sexp_write_char(ctx, '}', out);
  return SEXP_VOID;
}